

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O0

string * testing::internal::GetTypeName<std::__cxx11::string_const>(void)

{
  string *in_RDI;
  char *local_58;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *readable_name;
  char *pcStack_18;
  int status;
  char *name;
  string *name_str;
  
  pcStack_18 = CLI::std::type_info::name((type_info *)&std::__cxx11::string::typeinfo);
  readable_name._4_4_ = 0;
  local_28 = (char *)__cxa_demangle(pcStack_18,0,0,(long)&readable_name + 4);
  local_29 = 0;
  local_58 = local_28;
  if (readable_name._4_4_ != 0) {
    local_58 = pcStack_18;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_58,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  free(local_28);
  return in_RDI;
}

Assistant:

std::string GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#   endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}